

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6_prefix.c
# Opt level: O0

LY_ERR ipv6prefix_str2ip(char *value,size_t value_len,in6_addr *addr,uint8_t *prefix,
                        ly_err_item **err)

{
  int iVar1;
  char *pcVar2;
  char *mask_str;
  char *pref_str;
  LY_ERR ret;
  ly_err_item **err_local;
  uint8_t *prefix_local;
  in6_addr *addr_local;
  size_t value_len_local;
  char *value_local;
  
  pref_str._4_4_ = LY_SUCCESS;
  pcVar2 = ly_strnchr(value,0x2f,value_len);
  ly_strntou8(pcVar2 + 1,value_len - (long)(pcVar2 + (1 - (long)value)),prefix);
  pcVar2 = strndup(value,(long)pcVar2 - (long)value);
  if (pcVar2 == (char *)0x0) {
    pref_str._4_4_ = LY_EMEM;
  }
  else {
    iVar1 = inet_pton(10,pcVar2,addr);
    if (iVar1 != 1) {
      pref_str._4_4_ =
           ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                      "Failed to convert IPv6 address \"%s\".",pcVar2);
    }
  }
  free(pcVar2);
  return pref_str._4_4_;
}

Assistant:

static LY_ERR
ipv6prefix_str2ip(const char *value, size_t value_len, struct in6_addr *addr, uint8_t *prefix, struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    const char *pref_str;
    char *mask_str = NULL;

    /* it passed the pattern validation */
    pref_str = ly_strnchr(value, '/', value_len);
    ly_strntou8(pref_str + 1, value_len - (pref_str + 1 - value), prefix);

    /* get just the network prefix */
    mask_str = strndup(value, pref_str - value);
    LY_CHECK_ERR_GOTO(!mask_str, ret = LY_EMEM, cleanup);

    /* convert it to netword-byte order */
    if (inet_pton(AF_INET6, mask_str, addr) != 1) {
        ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Failed to convert IPv6 address \"%s\".", mask_str);
        goto cleanup;
    }

cleanup:
    free(mask_str);
    return ret;
}